

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O1

Error __thiscall asmjit::CodeBuilder::align(CodeBuilder *this,uint32_t mode,uint32_t alignment)

{
  Error EVar1;
  CBAlign *node;
  
  EVar1 = (this->super_CodeEmitter)._lastError;
  if (EVar1 == 0) {
    node = newAlignNode(this,mode,alignment);
    if (node == (CBAlign *)0x0) {
      EVar1 = CodeEmitter::setLastError(&this->super_CodeEmitter,1,(char *)0x0);
      return EVar1;
    }
    addNode(this,&node->super_CBNode);
    EVar1 = 0;
  }
  return EVar1;
}

Assistant:

Error CodeBuilder::align(uint32_t mode, uint32_t alignment) {
  if (_lastError) return _lastError;

  CBAlign* node = newAlignNode(mode, alignment);
  if (ASMJIT_UNLIKELY(!node))
    return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

  addNode(node);
  return kErrorOk;
}